

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pg_functions.cpp
# Opt level: O3

void duckdb_libpgquery::allocate_new(parser_state *state,size_t n)

{
  ulong uVar1;
  char **__src;
  size_t sVar2;
  char **__dest;
  char *pcVar3;
  undefined8 *puVar4;
  size_t __size;
  
  uVar1 = state->malloc_ptr_size;
  if (uVar1 <= state->malloc_ptr_idx) {
    __dest = (char **)calloc(1,uVar1 << 4);
    if (__dest == (char **)0x0) goto LAB_011ac578;
    __src = state->malloc_ptrs;
    switchD_00b041bd::default(__dest,__src,uVar1 << 3);
    free(__src);
    state->malloc_ptr_size = uVar1 * 2;
    state->malloc_ptrs = __dest;
  }
  __size = 0x2800;
  if (0x2800 < n) {
    __size = n;
  }
  pcVar3 = (char *)malloc(__size);
  if (pcVar3 != (char *)0x0) {
    sVar2 = state->malloc_ptr_idx;
    state->malloc_ptrs[sVar2] = pcVar3;
    state->malloc_ptr_idx = sVar2 + 1;
    state->malloc_pos = 0;
    return;
  }
LAB_011ac578:
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = rmdir;
  __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

static void allocate_new(parser_state *state, size_t n) {
	if (state->malloc_ptr_idx >= state->malloc_ptr_size) {
		size_t new_size = state->malloc_ptr_size * 2;
		auto new_malloc_ptrs = (char **) malloc(sizeof(char *) * new_size);
		if (!new_malloc_ptrs) {
			throw std::bad_alloc();
		}
		memset(new_malloc_ptrs, 0, sizeof(char*) * new_size);
		memcpy(new_malloc_ptrs, state->malloc_ptrs, state->malloc_ptr_size * sizeof(char*));
		free(state->malloc_ptrs);
		state->malloc_ptr_size = new_size;
		state->malloc_ptrs = new_malloc_ptrs;
	}
	if (n < PG_MALLOC_SIZE) {
		n = PG_MALLOC_SIZE;
	}
	auto base_ptr = (char *)malloc(n);
	if (!base_ptr) {
		throw std::bad_alloc();
	}
	state->malloc_ptrs[state->malloc_ptr_idx] = base_ptr;
	state->malloc_ptr_idx++;
	state->malloc_pos = 0;
}